

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O2

shared_ptr<mini_bus::IBaseNotifyToken<bool>_> __thiscall
mini_bus::MiniBusClient::ping(MiniBusClient *this,string_view payload)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string_view command;
  shared_ptr<mini_bus::IBaseNotifyToken<bool>_> sVar1;
  string_view payload_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  command._M_len = payload._M_len;
  command._M_str = (char *)0x4;
  payload_00._M_str = payload._M_str;
  payload_00._M_len = (size_t)"PING";
  send_simple_abi_cxx11_((MiniBusClient *)&stack0xffffffffffffffc0,command,payload_00);
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)payload._M_str;
  operator>><std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_codehz[P]mini_bus_cpp_include_mini_bus_hpp:499:44)>
            ((shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this,(anon_class_16_1_5476146e_for_func *)&stack0xffffffffffffffc0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  sVar1.super___shared_ptr<mini_bus::IBaseNotifyToken<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mini_bus::IBaseNotifyToken<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mini_bus::IBaseNotifyToken<bool>_>)
         sVar1.super___shared_ptr<mini_bus::IBaseNotifyToken<bool>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<IBaseNotifyToken<bool>> ping(std::string_view payload = {}) {
    return send_simple("PING", payload) >> [=](std::optional<std::string> str) { return str == payload; };
  }